

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O2

void TestEq<int,unsigned_long>(int expval,unsigned_long val,char *file,int line,char *func)

{
  stringstream ss2;
  stringstream ss1;
  char *local_378 [4];
  char *local_358 [4];
  stringstream local_338 [16];
  undefined1 local_328 [376];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if ((long)expval == val) {
    testing_success = testing_success + 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::ostream::operator<<(local_1a0,expval);
    std::__cxx11::stringstream::stringstream(local_338);
    std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    TestFail(local_358[0],local_378[0],file,line,func);
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::stringstream::~stringstream(local_338);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *file, int line, const char *func = 0)
  {
  if (U(expval) != val)
    {
    std::stringstream ss1;
    ss1 << expval;
    std::stringstream ss2;
    ss2 << val;
    TestFail(ss1.str().c_str(), ss2.str().c_str(), file, line, func);
    }
  else
    ++testing_success;
  }